

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

bool __thiscall Gluco::Solver::satisfied(Solver *this,Clause *c)

{
  lbool *plVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  if (this->incremental == 0) {
    uVar5 = *(ulong *)&c->header >> 0x20;
    iVar4 = (int)(*(ulong *)&c->header >> 0x20);
    bVar3 = 0 < iVar4;
    if ((0 < iVar4) &&
       (plVar1 = (this->assigns).data,
       plVar1[*(int *)&c[1].header >> 1].value != ((byte)*(int *)&c[1].header & 1))) {
      lVar2 = 0;
      do {
        lVar6 = lVar2;
        if (uVar5 - 1 == lVar6) break;
        iVar4 = *(int *)(&c[1].header.field_0x4 + lVar6 * 4);
        lVar2 = lVar6 + 1;
      } while (plVar1[iVar4 >> 1].value != ((byte)iVar4 & 1));
      return lVar6 + 1U < uVar5;
    }
  }
  else {
    plVar1 = (this->assigns).data;
    bVar3 = true;
    if (plVar1[*(int *)&c[1].header >> 1].value != ((byte)*(int *)&c[1].header & 1)) {
      iVar4 = *(int *)&c[1].header.field_0x4;
      return plVar1[iVar4 >> 1].value == ((byte)iVar4 & 1);
    }
  }
  return bVar3;
}

Assistant:

bool Solver::satisfied(const Clause& c) const {
  if(incremental)  // Check clauses with many selectors is too time consuming
    return (value(c[0]) == l_True) || (value(c[1]) == l_True);

  // Default mode.
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True)
            return true;
    return false; 
}